

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decoder_suite.cpp
# Opt level: O0

void basic_suite::test_false_white(void)

{
  undefined4 local_160;
  value local_15c [2];
  undefined4 local_154;
  value local_150 [2];
  undefined1 local_148 [8];
  decoder_type decoder;
  char cStack_10;
  char cStack_f;
  char cStack_e;
  char cStack_d;
  char cStack_c;
  char cStack_b;
  char input [10];
  
  decoder.current.scan._262_1_ = ' ';
  decoder.current.scan._263_1_ = ' ';
  cStack_10 = 'f';
  cStack_f = 'a';
  cStack_e = 'l';
  cStack_d = 's';
  cStack_c = 'e';
  cStack_b = ' ';
  trial::protocol::json::detail::basic_decoder<char>::basic_decoder<10ul>
            ((basic_decoder<char> *)local_148,
             (value_type (*) [10])((long)&decoder.current.scan + 0x106));
  local_150[0] = trial::protocol::json::detail::basic_decoder<char>::code
                           ((basic_decoder<char> *)local_148);
  local_154 = 7;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("decoder.code()","token::code::false_value",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/decoder_suite.cpp"
             ,0x114,"void basic_suite::test_false_white()",local_150,&local_154);
  trial::protocol::json::detail::basic_decoder<char>::next((basic_decoder<char> *)local_148);
  local_15c[0] = trial::protocol::json::detail::basic_decoder<char>::code
                           ((basic_decoder<char> *)local_148);
  local_160 = 0;
  boost::detail::
  test_with_impl<boost::detail::lw_test_eq,trial::protocol::json::token::code::value,trial::protocol::json::token::code::value>
            ("decoder.code()","token::code::end",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/json/decoder_suite.cpp"
             ,0x116,"void basic_suite::test_false_white()",local_15c,&local_160);
  return;
}

Assistant:

void test_false_white()
{
    const char input[] = "  false  ";
    decoder_type decoder(input);
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::false_value);
    decoder.next();
    TRIAL_PROTOCOL_TEST_EQUAL(decoder.code(), token::code::end);
}